

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O0

DOMElement * __thiscall
xercesc_4_0::DOMDocumentImpl::createElementNS
          (DOMDocumentImpl *this,XMLCh *fNamespaceURI,XMLCh *qualifiedName,XMLFileLoc lineNo,
          XMLFileLoc columnNo)

{
  bool bVar1;
  DOMException *this_00;
  MemoryManager *memoryManager;
  XSDElementNSImpl *this_01;
  XMLFileLoc columnNo_local;
  XMLFileLoc lineNo_local;
  XMLCh *qualifiedName_local;
  XMLCh *fNamespaceURI_local;
  DOMDocumentImpl *this_local;
  
  if (qualifiedName != (XMLCh *)0x0) {
    bVar1 = isXMLName(this,qualifiedName);
    if (bVar1) {
      this_01 = (XSDElementNSImpl *)operator_new(0xc0,this);
      XSDElementNSImpl::XSDElementNSImpl
                (this_01,&this->super_DOMDocument,fNamespaceURI,qualifiedName,lineNo,columnNo);
      return (DOMElement *)this_01;
    }
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  memoryManager = getMemoryManager(this);
  DOMException::DOMException(this_00,5,0,memoryManager);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMElement *DOMDocumentImpl::createElementNS(const XMLCh *fNamespaceURI,
                                              const XMLCh *qualifiedName,
                                              const XMLFileLoc lineNo,
                                              const XMLFileLoc columnNo)
{
    if(!qualifiedName || !isXMLName(qualifiedName))
        throw DOMException(DOMException::INVALID_CHARACTER_ERR,0, getMemoryManager());

    return new (this) XSDElementNSImpl(this, fNamespaceURI, qualifiedName, lineNo, columnNo);
}